

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::FunctionCallStmt::FunctionCallStmt
          (FunctionCallStmt *this,shared_ptr<kratos::FunctionStmtBlock> *func,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *args)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *pmVar5;
  element_type *peVar6;
  element_type *peVar7;
  bool *pbVar8;
  Generator *this_00;
  FunctionCallVar *pFVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar10 [16];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_370 [16];
  string local_360;
  FunctionCallVar *local_340;
  FunctionCallVar *p;
  Generator *generator;
  shared_ptr<kratos::Attribute> local_328;
  shared_ptr<kratos::Attribute> *local_318;
  pointer local_310;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_308;
  string local_2f0;
  undefined1 local_2ca;
  allocator<const_kratos::IRNode_*> local_2c9;
  element_type *local_2c8;
  element_type *local_2c0;
  element_type **local_2b8;
  size_type local_2b0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2a8;
  string local_290;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_270;
  mapped_type *arg_port;
  element_type *local_260;
  element_type **local_258;
  size_type local_250;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_248;
  string local_230;
  _Self local_210;
  _Self local_208;
  __shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *local_200;
  type *func_port;
  type *port_name;
  _Self local_1e8;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *__range1;
  undefined1 local_1c0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *args_local;
  shared_ptr<kratos::FunctionStmtBlock> *func_local;
  FunctionCallStmt *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_170;
  basic_string_view<char> local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_158;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  __buckets_ptr local_138;
  string *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_128;
  _Prime_rehash_policy local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_108;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_a0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char *local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_48;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  ports._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  Stmt::Stmt(&this->super_Stmt,FunctionalCall);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005a6670;
  std::shared_ptr<kratos::FunctionStmtBlock>::shared_ptr(&this->func_,func);
  std::shared_ptr<kratos::FunctionCallVar>::shared_ptr(&this->var_);
  peVar4 = std::
           __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)func);
  pmVar5 = FunctionStmtBlock::ports_abi_cxx11_(peVar4);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
         *)local_1c0,pmVar5);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                    *)local_1c0);
  local_1e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_1c0);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_1e8);
    if (!bVar1) {
      peVar4 = std::
               __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)func);
      this_00 = FunctionStmtBlock::generator(peVar4);
      p = (FunctionCallVar *)this_00;
      peVar4 = std::
               __shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)func);
      FunctionStmtBlock::function_name_abi_cxx11_((string *)(local_370 + 0x10),peVar4);
      pFVar9 = Generator::call(this_00,(string *)(local_370 + 0x10),
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                                *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,false);
      std::__cxx11::string::~string((string *)(local_370 + 0x10));
      local_340 = pFVar9;
      Var::as<kratos::FunctionCallVar>((Var *)local_370);
      std::shared_ptr<kratos::FunctionCallVar>::operator=
                (&this->var_,(shared_ptr<kratos::FunctionCallVar> *)local_370);
      std::shared_ptr<kratos::FunctionCallVar>::~shared_ptr
                ((shared_ptr<kratos::FunctionCallVar> *)local_370);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_1c0);
      return;
    }
    port_name = &std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>
                 ::operator*(&__end1)->first;
    func_port = (type *)std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Port>>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>
                                    *)port_name);
    local_200 = &std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Port>>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>
                             *)port_name)->
                 super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
    local_208._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)func_port);
    local_210._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator==(&local_208,&local_210);
    if (bVar1) {
      arg_port._6_1_ = 1;
      auVar10 = __cxa_allocate_exception(0x10);
      local_130 = &local_230;
      local_138 = (__buckets_ptr)0x437f45;
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)func_port;
      local_158.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string_const&,char[21],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0} is not connected",(v7 *)func_port,auVar10._8_8_,
                      (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                      "{0} is not connected");
      local_148 = &local_158;
      local_168 = fmt::v7::to_string_view<char,_0>((char *)local_138);
      local_58 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_60 = local_148;
      local_50 = local_148;
      local_40 = local_148;
      local_48 = local_58;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_58,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_148->string);
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_168.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_170.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_230,(detail *)local_168.data_,format_str,args_00);
      local_260 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get(local_200);
      local_258 = &local_260;
      local_250 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&arg_port + 7));
      __l_01._M_len = local_250;
      __l_01._M_array = (iterator)local_258;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_248,__l_01,(allocator<const_kratos::IRNode_*> *)((long)&arg_port + 7));
      VarException::VarException(auVar10._0_8_,&local_230,&local_248);
      arg_port._6_1_ = 0;
      __cxa_throw(auVar10._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
    local_270 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                       *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)func_port)->
                 super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
    peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_200);
    iVar2 = (*(peVar6->super_Var).super_IRNode._vptr_IRNode[7])();
    peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_270);
    iVar3 = (*(peVar7->super_IRNode)._vptr_IRNode[7])();
    if (iVar2 != iVar3) {
      local_2ca = 1;
      auVar10 = __cxa_allocate_exception(0x10);
      local_e0 = &local_290;
      local_e8 = "{0}\'s width doesn\'t match";
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)func_port;
      local_108.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string_const&,char[26],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"{0}\'s width doesn\'t match",(v7 *)func_port,auVar10._8_8_,
                      (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                      "{0}\'s width doesn\'t match");
      local_f8 = &local_108;
      local_118 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>(local_e8);
      local_68 = &local_128;
      local_70 = local_f8;
      local_38 = local_f8;
      local_28 = local_f8;
      local_30 = local_68;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_68,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_f8->string);
      format_str_00.size_ = local_128.desc_;
      format_str_00.data_ = (char *)local_118._M_next_resize;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_128.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_290,(detail *)local_118._0_8_,format_str_00,args_01);
      local_2c8 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get(local_200);
      local_2c0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_270);
      local_2b8 = &local_2c8;
      local_2b0 = 2;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_2c9);
      __l_00._M_len = local_2b0;
      __l_00._M_array = (iterator)local_2b8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_2a8,__l_00,&local_2c9);
      VarException::VarException(auVar10._0_8_,&local_290,&local_2a8);
      local_2ca = 0;
      __cxa_throw(auVar10._0_8_,&VarException::typeinfo,VarException::~VarException);
    }
    peVar6 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_200);
    pbVar8 = Var::is_signed(&peVar6->super_Var);
    bVar1 = *pbVar8;
    peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_270);
    pbVar8 = Var::is_signed(peVar7);
    if ((bVar1 & 1U) != (*pbVar8 & 1U)) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>
    ::operator++(&__end1);
  }
  generator._6_1_ = 1;
  auVar10 = __cxa_allocate_exception(0x10);
  local_88 = &local_2f0;
  local_90 = "{0}\'s sign doesn\'t match";
  vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)func_port;
  local_b8.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[25],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"{0}\'s sign doesn\'t match",(v7 *)func_port,auVar10._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "{0}\'s sign doesn\'t match");
  local_a0 = &local_b8;
  local_c8 = fmt::v7::to_string_view<char,_0>(local_90);
  local_78 = &local_d8;
  local_80 = local_a0;
  local_20 = local_a0;
  local_10 = local_a0;
  local_18 = local_78;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_78,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_a0->string);
  format_str_01.size_ = local_d8.desc_;
  format_str_01.data_ = (char *)local_c8.size_;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_02.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_d8.field_1.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_2f0,(detail *)local_c8.data_,format_str_01,args_02);
  local_328.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get(local_200);
  local_328.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_270);
  local_318 = &local_328;
  local_310 = (pointer)0x2;
  std::allocator<const_kratos::IRNode_*>::allocator
            ((allocator<const_kratos::IRNode_*> *)((long)&generator + 7));
  __l._M_len = (size_type)local_310;
  __l._M_array = (iterator)local_318;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_308,__l,(allocator<const_kratos::IRNode_*> *)((long)&generator + 7));
  VarException::VarException(auVar10._0_8_,&local_2f0,&local_308);
  generator._6_1_ = 0;
  __cxa_throw(auVar10._0_8_,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

FunctionCallStmt::FunctionCallStmt(const std::shared_ptr<FunctionStmtBlock> &func,
                                   const std::map<std::string, std::shared_ptr<Var>> &args)
    : Stmt(StatementType::FunctionalCall), func_(func) {
    // check the function call types
    auto ports = func->ports();
    for (auto const &[port_name, func_port] : ports) {
        if (args.find(port_name) == args.end()) {
            throw VarException(::format("{0} is not connected", port_name), {func_port.get()});
        }
        // check the port types
        const auto &arg_port = args.at(port_name);
        if (func_port->width() != arg_port->width())
            throw VarException(::format("{0}'s width doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
        if (func_port->is_signed() != arg_port->is_signed())
            throw VarException(::format("{0}'s sign doesn't match", port_name),
                               {func_port.get(), arg_port.get()});
    }
    auto *generator = func->generator();
    auto &p = generator->call(func->function_name(), args, false);
    var_ = p.as<FunctionCallVar>();
}